

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O1

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeTriang>::ComputeShape
          (TPZCompElHDivCollapsed<pzshape::TPZShapeTriang> *this,TPZVec<double> *qsi,
          TPZMaterialData *data)

{
  TPZFNMatrix<20,_double> *phi;
  double *pdVar1;
  int iVar2;
  TPZCompMesh *pTVar3;
  TPZGeoEl *pTVar4;
  long *plVar5;
  int d;
  long lVar6;
  int i;
  long lVar7;
  long newsize;
  TPZFMatrix<double> gradx;
  TPZFNMatrix<9,_double> gradxlocal;
  TPZFNMatrix<9,_double> axeslocal;
  TPZFMatrix<double> local_280;
  TPZFMatrix<double> local_1f0;
  double local_160 [10];
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  pTVar3 = TPZCompEl::Mesh((TPZCompEl *)this);
  TPZChunkVector<TPZConnect,_10>::operator[]
            (&(pTVar3->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,this->fbottom_c_index);
  pTVar3 = TPZCompEl::Mesh((TPZCompEl *)this);
  TPZChunkVector<TPZConnect,_10>::operator[]
            (&(pTVar3->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,this->ftop_c_index);
  iVar2 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                 super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 600))(this);
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  ExpandAxes(&(data->axes).super_TPZFMatrix<double>,&local_110.super_TPZMatrix<double>);
  local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_280.fElem = (double *)0x0;
  local_280.fGiven = (double *)0x0;
  local_280.fSize = 0;
  TPZVec<int>::TPZVec(&local_280.fPivot.super_TPZVec<int>,0);
  local_280.fPivot.super_TPZVec<int>.fStore = local_280.fPivot.fExtAlloc;
  local_280.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_280.fPivot.super_TPZVec<int>.fNElements = 0;
  local_280.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_280.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_280.fWork.fStore = (double *)0x0;
  local_280.fWork.fNElements = 0;
  local_280.fWork.fNAlloc = 0;
  local_280.fElem = (double *)operator_new__(0x30);
  local_280.fElem[4] = 0.0;
  local_280.fElem[5] = 0.0;
  local_280.fElem[2] = 0.0;
  local_280.fElem[3] = 0.0;
  *local_280.fElem = 0.0;
  local_280.fElem[1] = 0.0;
  pTVar4 = TPZCompEl::Reference((TPZCompEl *)this);
  (**(code **)(*(long *)pTVar4 + 0x230))(pTVar4,qsi,&local_280);
  local_1f0.fElem = local_160;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_1f0.fSize = 9;
  local_1f0.fGiven = local_1f0.fElem;
  TPZVec<int>::TPZVec(&local_1f0.fPivot.super_TPZVec<int>,0);
  newsize = (long)iVar2;
  local_1f0.fPivot.super_TPZVec<int>.fStore = local_1f0.fPivot.fExtAlloc;
  local_1f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1f0.fWork.fStore = (double *)0x0;
  local_1f0.fWork.fNElements = 0;
  local_1f0.fWork.fNAlloc = 0;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  lVar7 = 0;
  while( true ) {
    lVar6 = 0;
    do {
      if ((local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
         (local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
         (local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1f0.fElem[local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6 + lVar7] =
           local_280.fElem
           [local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6 + lVar7];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    if ((local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
       (local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
       (local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) break;
    local_1f0.fElem[local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + lVar7] =
         local_110.fElem[local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + 2];
    lVar7 = lVar7 + 1;
    if (lVar7 == 3) {
      phi = &data->phi;
      TPZShapeHDivCollapsed<pzshape::TPZShapeTriang>::Shape
                (qsi,&data->super_TPZShapeData,&phi->super_TPZFMatrix<double>,
                 &(data->divphi).super_TPZFMatrix<double>);
      TPZFMatrix<double>::operator*=(&(data->divphi).super_TPZFMatrix<double>,1.0 / data->detjac);
      TPZMatrix<double>::Multiply
                (&local_1f0.super_TPZMatrix<double>,&phi->super_TPZFMatrix<double>,
                 &(data->fDeformedDirections).super_TPZFMatrix<double>,0);
      TPZFMatrix<double>::operator*=
                (&(data->fDeformedDirections).super_TPZFMatrix<double>,1.0 / data->detjac);
      TPZManVector<std::pair<int,_long>,_20>::Resize(&data->fVecShapeIndex,newsize);
      TPZFMatrix<double>::Resize(&phi->super_TPZFMatrix<double>,newsize,1);
      if (0 < iVar2) {
        pdVar1 = (data->phi).super_TPZFMatrix<double>.fElem;
        plVar5 = &((data->fVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore)->second;
        lVar7 = 0;
        do {
          ((pair<int,_long> *)(plVar5 + -1))->first = (int)lVar7;
          *plVar5 = lVar7;
          pdVar1[lVar7] = 1.0;
          lVar7 = lVar7 + 1;
          plVar5 = plVar5 + 2;
        } while (newsize != lVar7);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_1f0,&PTR_PTR_0183dba8);
      TPZFMatrix<double>::~TPZFMatrix(&local_280);
      TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_0183dba8);
      return;
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZCompElHDivCollapsed<TSHAPE>::ComputeShape(TPZVec<REAL> &qsi, TPZMaterialData &data) {


    // Some variable definitions
    TPZConnect& connbot = this->Mesh()->ConnectVec()[fbottom_c_index];
    TPZConnect& conntop = this->Mesh()->ConnectVec()[ftop_c_index];
    const int toporder = conntop.Order();
    const int bottomorder = connbot.Order();
    const int64_t nvec_top = conntop.NShape();
    const int64_t nvec_bottom = connbot.NShape();
    const int64_t nvecshapecollpased = this->NShapeF();
    const int64_t numvec = nvecshapecollpased - nvec_top - nvec_bottom;
    const int dim = TSHAPE::Dimension+1;
    
    // Expanding element axes
    TPZFNMatrix<9,REAL> axeslocal(TSHAPE::Dimension+1,3);
    ExpandAxes(data.axes, axeslocal);
    
    // adding a column do gradx pointing to the normal direction (direction that communicates with the 3d neighbor element)
    TPZFMatrix<REAL> gradx(3,TSHAPE::Dimension,0.);
    this->Reference()->GradX(qsi, gradx);
    TPZFNMatrix<9> gradxlocal(3,dim);
    for (int i=0; i<3; i++) {
        for (int d=0; d<dim-1; d++) {
            gradxlocal(i,d) = gradx(i,d);
        }
        gradxlocal(i,dim-1) = axeslocal(dim-1,i);
    }
    
    // Computing shape functions using TPZShapeHDivCollapsed structure
    TPZShapeData& shapedata = data;
    TPZShapeHDivCollapsed<TSHAPE>::Shape(qsi,shapedata,data.phi,data.divphi);
    data.divphi *= 1./data.detjac;
    gradxlocal.Multiply(data.phi,data.fDeformedDirections);
    data.fDeformedDirections *= 1./data.detjac;
    
    // Filling phi with 1 and fVecShapeIndex with 1,1 to make actual materials work
    data.fVecShapeIndex.Resize(nvecshapecollpased);
    data.phi.Resize(nvecshapecollpased,1);
    for(int i=0; i<nvecshapecollpased; i++)
    {
        data.fVecShapeIndex[i] = std::pair<int,int64_t>(i,i);
        data.phi(i) = 1.;
    }
}